

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int fio_glob_match(fio_str_info_s pat,fio_str_info_s ch)

{
  byte *pbVar1;
  long lVar2;
  byte *pbVar3;
  byte bVar4;
  byte bVar5;
  byte *pbVar6;
  long lVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte bVar11;
  byte *pbVar12;
  byte bVar13;
  byte bVar14;
  bool bVar15;
  byte *pbVar16;
  byte *in_stack_00000010;
  byte *in_stack_00000018;
  long in_stack_00000028;
  byte *in_stack_00000030;
  int local_4c;
  byte *local_48;
  long local_40;
  byte *local_38;
  
  local_38 = (byte *)0x0;
  local_40 = in_stack_00000028;
  local_48 = in_stack_00000030;
  pbVar9 = (byte *)0x0;
  do {
    if (in_stack_00000028 == 0) {
      return (uint)(in_stack_00000010 == (byte *)0x0);
    }
    pbVar1 = in_stack_00000030 + 1;
    bVar4 = *in_stack_00000030;
    pbVar12 = in_stack_00000018 + 1;
    bVar13 = *in_stack_00000018;
    lVar2 = in_stack_00000028 + -1;
    pbVar3 = in_stack_00000010 + -1;
    bVar15 = false;
    pbVar10 = pbVar9;
    pbVar6 = local_48;
    lVar7 = local_40;
    pbVar8 = local_38;
    if (bVar13 < 0x5b) {
      if (bVar13 == 0x2a) {
        pbVar10 = pbVar12;
        in_stack_00000010 = pbVar3;
        pbVar6 = in_stack_00000030;
        lVar7 = in_stack_00000028;
        pbVar8 = pbVar3;
        bVar15 = false;
        if (pbVar3 == (byte *)0x0) {
          local_4c = 1;
          pbVar10 = pbVar9;
          in_stack_00000028 = lVar2;
          in_stack_00000030 = pbVar1;
          pbVar6 = local_48;
          lVar7 = local_40;
          pbVar8 = local_38;
          bVar15 = true;
        }
      }
      else {
        in_stack_00000028 = lVar2;
        in_stack_00000030 = pbVar1;
        in_stack_00000010 = pbVar3;
        if (bVar13 != 0x3f) goto LAB_00131241;
      }
    }
    else if (bVar13 == 0x5b) {
      pbVar16 = pbVar12 + (*pbVar12 == 0x5e) + 1;
      bVar13 = pbVar12[*pbVar12 == 0x5e];
      bVar15 = false;
      do {
        bVar14 = bVar13;
        bVar11 = bVar13;
        if ((*pbVar16 == 0x2d) && (bVar5 = pbVar16[1], bVar5 != 0x5d)) {
          pbVar16 = pbVar16 + 2;
          bVar14 = bVar5;
          if (bVar13 < bVar5) {
            bVar14 = bVar13;
          }
          bVar11 = bVar5;
          if (bVar5 < bVar13) {
            bVar11 = bVar13;
          }
        }
        bVar15 = (bool)(bVar15 | (bVar4 <= bVar11 && bVar14 <= bVar4));
        bVar13 = *pbVar16;
        pbVar16 = pbVar16 + 1;
      } while (bVar13 != 0x5d);
      in_stack_00000010 = pbVar3;
      if (bVar15 == (*pbVar12 == 0x5e)) goto LAB_00131318;
      in_stack_00000010 = pbVar12 + ((long)pbVar3 - (long)pbVar16);
      in_stack_00000028 = lVar2;
      pbVar12 = pbVar16;
      in_stack_00000030 = pbVar1;
      bVar15 = false;
    }
    else {
      if (bVar13 == 0x5c) {
        pbVar12 = in_stack_00000018 + 2;
        bVar13 = in_stack_00000018[1];
        pbVar3 = in_stack_00000010 + -2;
      }
LAB_00131241:
      in_stack_00000010 = pbVar3;
      in_stack_00000028 = lVar2;
      in_stack_00000030 = pbVar1;
      if (bVar4 != bVar13) {
LAB_00131318:
        if (pbVar9 == (byte *)0x0) {
          local_4c = 0;
          pbVar10 = (byte *)0x0;
          in_stack_00000028 = lVar2;
          in_stack_00000030 = pbVar1;
          bVar15 = true;
        }
        else {
          in_stack_00000010 = local_38;
          in_stack_00000028 = local_40 + -1;
          pbVar12 = pbVar9;
          in_stack_00000030 = local_48 + 1;
          pbVar6 = local_48 + 1;
          lVar7 = local_40 + -1;
          bVar15 = false;
        }
      }
    }
    local_38 = pbVar8;
    local_40 = lVar7;
    local_48 = pbVar6;
    pbVar9 = pbVar10;
    in_stack_00000018 = pbVar12;
    if (bVar15) {
      return local_4c;
    }
  } while( true );
}

Assistant:

static int fio_glob_match(fio_str_info_s pat, fio_str_info_s ch) {
  /* adapted and rewritten, with thankfulness, from the code at:
   * https://github.com/opnfv/kvmfornfv/blob/master/kernel/lib/glob.c
   *
   * Original version's copyright:
   * Copyright 2015 Open Platform for NFV Project, Inc. and its contributors
   * Under the MIT license.
   */

  /*
   * Backtrack to previous * on mismatch and retry starting one
   * character later in the string.  Because * matches all characters,
   * there's never a need to backtrack multiple levels.
   */
  uint8_t *back_pat = NULL, *back_str = (uint8_t *)ch.data;
  size_t back_pat_len = 0, back_str_len = ch.len;

  /*
   * Loop over each token (character or class) in pat, matching
   * it against the remaining unmatched tail of str.  Return false
   * on mismatch, or true after matching the trailing nul bytes.
   */
  while (ch.len) {
    uint8_t c = *(uint8_t *)ch.data++;
    uint8_t d = *(uint8_t *)pat.data++;
    ch.len--;
    pat.len--;

    switch (d) {
    case '?': /* Wildcard: anything goes */
      break;

    case '*':       /* Any-length wildcard */
      if (!pat.len) /* Optimize trailing * case */
        return 1;
      back_pat = (uint8_t *)pat.data;
      back_pat_len = pat.len;
      back_str = (uint8_t *)--ch.data; /* Allow zero-length match */
      back_str_len = ++ch.len;
      break;

    case '[': { /* Character class */
      uint8_t match = 0, inverted = (*(uint8_t *)pat.data == '^');
      uint8_t *cls = (uint8_t *)pat.data + inverted;
      uint8_t a = *cls++;

      /*
       * Iterate over each span in the character class.
       * A span is either a single character a, or a
       * range a-b.  The first span may begin with ']'.
       */
      do {
        uint8_t b = a;

        if (cls[0] == '-' && cls[1] != ']') {
          b = cls[1];

          cls += 2;
          if (a > b) {
            uint8_t tmp = a;
            a = b;
            b = tmp;
          }
        }
        match |= (a <= c && c <= b);
      } while ((a = *cls++) != ']');

      if (match == inverted)
        goto backtrack;
      pat.len -= cls - (uint8_t *)pat.data;
      pat.data = (char *)cls;

    } break;
    case '\\':
      d = *(uint8_t *)pat.data++;
      pat.len--;
    /* fallthrough */
    default: /* Literal character */
      if (c == d)
        break;
    backtrack:
      if (!back_pat)
        return 0; /* No point continuing */
      /* Try again from last *, one character later in str. */
      pat.data = (char *)back_pat;
      ch.data = (char *)++back_str;
      ch.len = --back_str_len;
      pat.len = back_pat_len;
    }
  }
  return !ch.len && !pat.len;
}